

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O1

void BIP32Hash(ChainCode *chainCode,uint nChild,uchar header,uchar *data,uchar *output)

{
  CSHA512 *this;
  long in_FS_OFFSET;
  uchar num [4];
  uchar local_1cd;
  uint local_1cc;
  CHMAC_SHA512 local_1c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1cc = nChild >> 0x18 | (nChild & 0xff0000) >> 8 | (nChild & 0xff00) << 8 | nChild << 0x18;
  local_1cd = header;
  CHMAC_SHA512::CHMAC_SHA512(&local_1c8,(uchar *)chainCode,0x20);
  this = &local_1c8.inner;
  CSHA512::Write(this,&local_1cd,1);
  CSHA512::Write(this,data,0x20);
  CSHA512::Write(this,(uchar *)&local_1cc,4);
  CHMAC_SHA512::Finalize(&local_1c8,output);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BIP32Hash(const ChainCode &chainCode, unsigned int nChild, unsigned char header, const unsigned char data[32], unsigned char output[64])
{
    unsigned char num[4];
    WriteBE32(num, nChild);
    CHMAC_SHA512(chainCode.begin(), chainCode.size()).Write(&header, 1).Write(data, 32).Write(num, 4).Finalize(output);
}